

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O3

void ResizeNodeDistPages(void)

{
  int iVar1;
  NodeDist_t **ppNVar2;
  ulong uVar3;
  uint uVar4;
  NodeDist_t **__ptr;
  long lVar5;
  
  iVar1 = nodeDistPage;
  lVar5 = (long)nodeDistPage;
  uVar4 = nodeDistPage + 1;
  nodeDistPage = uVar4;
  ppNVar2 = nodeDistPages;
  if (uVar4 == maxNodeDistPages) {
    ppNVar2 = (NodeDist_t **)malloc(lVar5 * 8 + 0x408);
    __ptr = nodeDistPages;
    if (ppNVar2 == (NodeDist_t **)0x0) {
      if (iVar1 < 0) {
        if (nodeDistPages == (NodeDist_t **)0x0) {
          memOut = 1;
          return;
        }
      }
      else {
        uVar3 = 0;
        do {
          if (__ptr[uVar3] != (NodeDist_t *)0x0) {
            free(__ptr[uVar3]);
            __ptr[uVar3] = (NodeDist_t *)0x0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      goto LAB_00799f4b;
    }
    maxNodeDistPages = iVar1 + 0x81;
    if (iVar1 < 0) {
      if (nodeDistPages == (NodeDist_t **)0x0) goto LAB_00799eee;
    }
    else {
      uVar3 = 0;
      do {
        ppNVar2[uVar3] = __ptr[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
    free(__ptr);
  }
LAB_00799eee:
  nodeDistPages = ppNVar2;
  __ptr = nodeDistPages;
  currentNodeDistPage = (NodeDist_t *)malloc(0x10000);
  __ptr[lVar5 + 1] = currentNodeDistPage;
  if (currentNodeDistPage != (NodeDist_t *)0x0) {
    nodeDistPageIndex = 0;
    return;
  }
  currentNodeDistPage = (NodeDist_t *)0x0;
  if (-1 < iVar1) {
    uVar3 = 0;
    do {
      if (__ptr[uVar3] != (NodeDist_t *)0x0) {
        free(__ptr[uVar3]);
        __ptr[uVar3] = (NodeDist_t *)0x0;
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
LAB_00799f4b:
  free(__ptr);
  nodeDistPages = (NodeDist_t **)0x0;
  memOut = 1;
  return;
}

Assistant:

static void
ResizeNodeDistPages(void)
{
    int i;
    NodeDist_t **newNodeDistPages;

    /* move to next page */
    nodeDistPage++;

    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. Page numbers are incremented by
     * INITIAL_PAGES
     */
    if (nodeDistPage == maxNodeDistPages) {
        newNodeDistPages = ABC_ALLOC(NodeDist_t *,maxNodeDistPages + INITIAL_PAGES);
        if (newNodeDistPages == NULL) {
            for (i = 0; i < nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
            ABC_FREE(nodeDistPages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxNodeDistPages; i++) {
                newNodeDistPages[i] = nodeDistPages[i];
            }
            /* Increase total page count */
            maxNodeDistPages += INITIAL_PAGES;
            ABC_FREE(nodeDistPages);
            nodeDistPages = newNodeDistPages;
        }
    }
    /* Allocate a new page */
    currentNodeDistPage = nodeDistPages[nodeDistPage] = ABC_ALLOC(NodeDist_t,
                                                              nodeDistPageSize);
    if (currentNodeDistPage == NULL) {
        for (i = 0; i < nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
        ABC_FREE(nodeDistPages);
        memOut = 1;
        return;
    }
    /* reset page index */
    nodeDistPageIndex = 0;
    return;

}